

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_verify_param(REF_GRID ref_grid)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_MPI pRVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  REF_DBL max;
  REF_DBL global_max;
  REF_MPI local_90;
  REF_DBL max_node;
  REF_BOOL node_constraint;
  double local_78;
  double local_70;
  REF_DBL xyz [3];
  REF_DBL max_edge;
  REF_BOOL edge_constraint;
  
  ref_geom = ref_grid->geom;
  if (ref_geom->model == (void *)0x0) {
    uVar4 = 0;
  }
  else {
    pRVar6 = ref_grid->mpi;
    pRVar2 = ref_grid->node;
    max = 0.0;
    lVar10 = 0;
    local_90 = pRVar6;
    for (lVar9 = 0; lVar9 < ref_geom->max; lVar9 = lVar9 + 1) {
      if ((*(int *)((long)ref_geom->descr + lVar10) == 0) &&
         (lVar8 = (long)*(int *)((long)ref_geom->descr + lVar10 + 0x14),
         pRVar6->id == pRVar2->part[lVar8])) {
        uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar9,xyz,(REF_DBL *)0x0);
        if (uVar4 != 0) {
          pcVar7 = "eval xyz";
          uVar5 = 0x761;
          goto LAB_00171bfb;
        }
        pRVar3 = pRVar2->real;
        dVar11 = SQRT((xyz[2] - pRVar3[lVar8 * 0xf + 2]) * (xyz[2] - pRVar3[lVar8 * 0xf + 2]) +
                      (xyz[1] - pRVar3[lVar8 * 0xf + 1]) * (xyz[1] - pRVar3[lVar8 * 0xf + 1]) +
                      (xyz[0] - pRVar3[lVar8 * 0xf]) * (xyz[0] - pRVar3[lVar8 * 0xf]));
        pRVar6 = local_90;
        if (max <= dVar11) {
          max = dVar11;
        }
      }
      lVar10 = lVar10 + 0x18;
    }
    uVar4 = ref_mpi_max(pRVar6,&max,&global_max,3);
    if (uVar4 == 0) {
      max = global_max;
      if (ref_grid->mpi->id == 0) {
        printf("CAD topo node max eval dist %e\n");
      }
      max = 0.0;
      max_node = 0.0;
      local_78 = 0.0;
      lVar10 = 0;
      pRVar6 = local_90;
      for (lVar9 = 0; lVar9 < ref_geom->max; lVar9 = lVar9 + 1) {
        if (*(int *)((long)ref_geom->descr + lVar10) == 1) {
          iVar1 = *(int *)((long)ref_geom->descr + lVar10 + 0x14);
          lVar8 = (long)iVar1;
          if (pRVar6->id == pRVar2->part[lVar8]) {
            uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar9,xyz,(REF_DBL *)0x0);
            if (uVar4 != 0) {
              pcVar7 = "eval xyz";
              uVar5 = 0x770;
              goto LAB_00171bfb;
            }
            pRVar3 = pRVar2->real;
            local_70 = SQRT((xyz[2] - pRVar3[lVar8 * 0xf + 2]) * (xyz[2] - pRVar3[lVar8 * 0xf + 2])
                            + (xyz[1] - pRVar3[lVar8 * 0xf + 1]) *
                              (xyz[1] - pRVar3[lVar8 * 0xf + 1]) +
                              (xyz[0] - pRVar3[lVar8 * 0xf]) * (xyz[0] - pRVar3[lVar8 * 0xf]));
            ref_geom_is_a(ref_geom,iVar1,0,&node_constraint);
            pRVar6 = local_90;
            if (node_constraint == 0) {
              if (max <= local_70) {
                max = local_70;
              }
            }
            else {
              max_node = local_78;
              if (local_78 <= local_70) {
                max_node = local_70;
                local_78 = local_70;
              }
            }
          }
        }
        lVar10 = lVar10 + 0x18;
      }
      uVar4 = ref_mpi_max(pRVar6,&max,&global_max,3);
      if (uVar4 == 0) {
        max = global_max;
        if (ref_grid->mpi->id == 0) {
          printf("CAD topo edge max eval dist %e\n");
        }
        uVar4 = ref_mpi_max(local_90,&max_node,&global_max,3);
        if (uVar4 == 0) {
          max_node = global_max;
          if (ref_grid->mpi->id == 0) {
            printf("CAD topo edge node tol %e\n");
          }
          max = 0.0;
          max_node = 0.0;
          max_edge = 0.0;
          local_78 = 0.0;
          lVar9 = 0;
          pRVar6 = local_90;
          for (lVar10 = 0; lVar10 < ref_geom->max; lVar10 = lVar10 + 1) {
            if (*(int *)((long)ref_geom->descr + lVar9) == 2) {
              iVar1 = *(int *)((long)ref_geom->descr + lVar9 + 0x14);
              lVar8 = (long)iVar1;
              if (pRVar6->id == pRVar2->part[lVar8]) {
                uVar4 = ref_egads_eval(ref_geom,(REF_INT)lVar10,xyz,(REF_DBL *)0x0);
                if (uVar4 != 0) {
                  pcVar7 = "eval xyz";
                  uVar5 = 0x789;
                  goto LAB_00171bfb;
                }
                pRVar3 = pRVar2->real;
                local_70 = SQRT((xyz[2] - pRVar3[lVar8 * 0xf + 2]) *
                                (xyz[2] - pRVar3[lVar8 * 0xf + 2]) +
                                (xyz[1] - pRVar3[lVar8 * 0xf + 1]) *
                                (xyz[1] - pRVar3[lVar8 * 0xf + 1]) +
                                (xyz[0] - pRVar3[lVar8 * 0xf]) * (xyz[0] - pRVar3[lVar8 * 0xf]));
                ref_geom_is_a(ref_geom,iVar1,0,&node_constraint);
                ref_geom_is_a(ref_geom,iVar1,1,&edge_constraint);
                pRVar6 = local_90;
                if (node_constraint == 0) {
                  if (edge_constraint == 0) {
                    if (max <= local_70) {
                      max = local_70;
                    }
                  }
                  else {
                    max_edge = local_78;
                    if (local_78 <= local_70) {
                      local_78 = local_70;
                      max_edge = local_70;
                    }
                  }
                }
                else if (max_node <= local_70) {
                  max_node = local_70;
                }
              }
            }
            lVar9 = lVar9 + 0x18;
          }
          uVar4 = ref_mpi_max(pRVar6,&max,&global_max,3);
          if (uVar4 == 0) {
            max = global_max;
            if (ref_grid->mpi->id == 0) {
              printf("CAD topo face max eval dist %e\n");
            }
            uVar4 = ref_mpi_max(local_90,&max_edge,&global_max,3);
            if (uVar4 == 0) {
              max_edge = global_max;
              if (ref_grid->mpi->id == 0) {
                printf("CAD topo face edge tol %e\n");
              }
              uVar4 = ref_mpi_max(local_90,&max_node,&global_max,3);
              if (uVar4 == 0) {
                max_node = global_max;
                if (ref_grid->mpi->id != 0) {
                  return 0;
                }
                printf("CAD topo face node tol %e\n");
                return 0;
              }
              pcVar7 = "mpi max edge";
              uVar5 = 0x7a1;
            }
            else {
              pcVar7 = "mpi max edge";
              uVar5 = 0x79d;
            }
          }
          else {
            pcVar7 = "mpi max face";
            uVar5 = 0x799;
          }
        }
        else {
          pcVar7 = "mpi max edge";
          uVar5 = 0x77f;
        }
      }
      else {
        pcVar7 = "mpi max edge";
        uVar5 = 0x77b;
      }
    }
    else {
      pcVar7 = "mpi max node";
      uVar5 = 0x767;
    }
LAB_00171bfb:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
           "ref_geom_verify_param",(ulong)uVar4,pcVar7);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_param(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom;
  REF_INT node;
  REF_DBL xyz[3];
  REF_DBL dist, max, max_node, max_edge, global_max;
  REF_BOOL node_constraint, edge_constraint;

  if (!ref_geom_model_loaded(ref_geom)) return REF_SUCCESS;

  max = 0.0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    max = MAX(max, dist);
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max node");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo node max eval dist %e\n", max);

  max = 0.0;
  max_node = 0.0;
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      max = MAX(max, dist);
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max edge");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo edge node tol %e\n", max_node);

  max = 0.0;
  max_node = 0.0;
  max_edge = 0.0;
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) continue;
    RSS(ref_egads_eval(ref_geom, geom, xyz, NULL), "eval xyz");
    dist = sqrt(pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
                pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
                pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2));
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &node_constraint), "n");
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &edge_constraint), "n");
    if (node_constraint) {
      max_node = MAX(max_node, dist);
    } else {
      if (edge_constraint) {
        max_edge = MAX(max_edge, dist);
      } else {
        max = MAX(max, dist);
      }
    }
  }
  RSS(ref_mpi_max(ref_mpi, &max, &global_max, REF_DBL_TYPE), "mpi max face");
  max = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face max eval dist %e\n", max);
  RSS(ref_mpi_max(ref_mpi, &max_edge, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_edge = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face edge tol %e\n", max_edge);
  RSS(ref_mpi_max(ref_mpi, &max_node, &global_max, REF_DBL_TYPE),
      "mpi max edge");
  max_node = global_max;
  if (ref_grid_once(ref_grid)) printf("CAD topo face node tol %e\n", max_node);

  return REF_SUCCESS;
}